

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int m_se_decode(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  uint32_t uVar2;
  uint32_t s;
  int32_t d1;
  int32_t m;
  internal_state_conflict *state;
  aec_stream_conflict *strm_local;
  
  piVar1 = strm->state;
  while( true ) {
    if (strm->block_size <= piVar1->sample_counter) {
      piVar1->mode = m_next_cds;
      return 1;
    }
    uVar2 = fs_ask(strm);
    if (uVar2 == 0) {
      return 0;
    }
    uVar2 = piVar1->fs;
    if (0x5a < (int)uVar2) {
      return -1;
    }
    s = uVar2 - piVar1->se_table[(int)(uVar2 * 2 + 1)];
    if ((piVar1->sample_counter & 1) == 0) {
      if (strm->avail_out < (ulong)piVar1->bytes_per_sample) {
        return 0;
      }
      put_sample(strm,piVar1->se_table[(int)(uVar2 << 1)] - s);
      piVar1->sample_counter = piVar1->sample_counter + 1;
    }
    if (strm->avail_out < (ulong)piVar1->bytes_per_sample) break;
    put_sample(strm,s);
    piVar1->sample_counter = piVar1->sample_counter + 1;
    fs_drop(strm);
  }
  return 0;
}

Assistant:

static int m_se_decode(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    while(state->sample_counter < strm->block_size) {
        int32_t m;
        int32_t d1;
        if (fs_ask(strm) == 0)
            return M_EXIT;
        m = state->fs;
        if (m > SE_TABLE_SIZE)
            return M_ERROR;
        d1 = m - state->se_table[2 * m + 1];

        if ((state->sample_counter & 1) == 0) {
            if (strm->avail_out < state->bytes_per_sample)
                return M_EXIT;
            put_sample(strm, state->se_table[2 * m] - d1);
            state->sample_counter++;
        }

        if (strm->avail_out < state->bytes_per_sample)
            return M_EXIT;
        put_sample(strm, d1);
        state->sample_counter++;
        fs_drop(strm);
    }

    state->mode = m_next_cds;
    return M_CONTINUE;
}